

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void do_cmd_sell(command_conflict *cmd)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t guess;
  wchar_t value_00;
  store_conflict *store_00;
  object *poVar3;
  _Bool local_201;
  object *poStack_200;
  _Bool none_left;
  object *sold_item;
  object *obj;
  char local_1e8 [7];
  char label;
  char o_name [120];
  wchar_t value;
  wchar_t dummy;
  wchar_t price;
  store_conflict *store;
  object dummy_item;
  wchar_t amt;
  command_conflict *cmd_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  store_00 = store_at((chunk *)cave,grid);
  local_201 = false;
  wVar2 = cmd_get_arg_item((command *)cmd,"item",&sold_item);
  if ((wVar2 == L'\0') &&
     (wVar2 = cmd_get_quantity((command *)cmd,"quantity",(int *)((long)&dummy_item.note + 4),
                               (uint)sold_item->number), wVar2 == L'\0')) {
    _Var1 = object_is_equipped(player->body,sold_item);
    if ((!_Var1) || (_Var1 = obj_can_takeoff(sold_item), _Var1)) {
      if (store_00 == (store_conflict *)0x0) {
        msg("You cannot sell items when not in a store.");
      }
      else {
        _Var1 = store_will_buy(store_00,sold_item);
        if (_Var1) {
          object_copy_amt((object *)&store,sold_item,dummy_item.note._4_4_);
          _Var1 = store_check_num(store_00,(object *)&store);
          if (_Var1) {
            obj._7_1_ = gear_to_label(player,sold_item);
            wVar2 = price_item(store_00,(object *)&store,true,dummy_item.note._4_4_);
            player->au = wVar2 + player->au;
            if (sold_item->artifact != (artifact *)0x0) {
              history_find_artifact(player,sold_item->artifact);
            }
            player->upkeep->update = player->upkeep->update | 0x200;
            player->upkeep->notice = player->upkeep->notice | 1;
            player->upkeep->redraw = player->upkeep->redraw | 0x60000;
            guess = object_value((object *)&store,dummy_item.note._4_4_);
            object_wipe((object *)&store);
            object_flavor_aware(player,sold_item);
            sold_item->known->effect = sold_item->effect;
            while (_Var1 = object_fully_known(sold_item), ((_Var1 ^ 0xffU) & 1) != 0) {
              object_learn_unknown_rune(player,sold_item);
              player_know_object(player,sold_item);
            }
            poStack_200 = gear_object_for_use(player,sold_item,dummy_item.note._4_4_,false,
                                              &local_201);
            value_00 = object_value_real(poStack_200,dummy_item.note._4_4_);
            object_desc(local_1e8,0x78,poStack_200,0x43,player);
            if (((player->opts).opt[0x26] & 1U) == 0) {
              msg("You sold %s (%c) for %d gold.",local_1e8,(ulong)(uint)(int)obj._7_1_,
                  (ulong)(uint)wVar2);
              purchase_analyze(wVar2,value_00,guess);
            }
            else {
              msg("You had %s (%c).",local_1e8,(ulong)(uint)(int)obj._7_1_);
            }
            if ((local_201 & 1U) == 0) {
              apply_autoinscription(player,sold_item);
            }
            player->upkeep->notice = player->upkeep->notice | 2;
            notice_stuff(player);
            handle_stuff(player);
            poVar3 = store_carry(store_00,poStack_200);
            if (poVar3 == (object *)0x0) {
              if (poStack_200->artifact != (artifact *)0x0) {
                history_lose_artifact(player,poStack_200->artifact);
              }
              if (poStack_200->known != (object *)0x0) {
                object_delete((chunk *)0x0,(chunk *)0x0,&poStack_200->known);
                poStack_200->known = (object *)0x0;
              }
              object_delete((chunk *)0x0,(chunk *)0x0,&stack0xfffffffffffffe00);
            }
            event_signal(EVENT_STORECHANGED);
            event_signal(EVENT_INVENTORY);
            event_signal(EVENT_EQUIPMENT);
          }
          else {
            object_wipe((object *)&store);
            msg("I have not the room in my store to keep it.");
          }
        }
        else {
          msg("I do not wish to purchase this item.");
        }
      }
    }
    else {
      msg("Hmmm, it seems to be stuck.");
    }
  }
  return;
}

Assistant:

void do_cmd_sell(struct command *cmd)
{
	int amt;
	struct object dummy_item;
	struct store *store = store_at(cave, player->grid);
	int price, dummy, value;
	char o_name[120];
	char label;

	struct object *obj, *sold_item;
	bool none_left = false;

	/* Get arguments */
	/* XXX-AS fill this out, split into cmd-store.c */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}

	/* Check we are somewhere we can sell the items. */
	if (!store) {
		msg("You cannot sell items when not in a store.");
		return;
	}

	/* Check the store wants the items being sold */
	if (!store_will_buy(store, obj)) {
		msg("I do not wish to purchase this item.");
		return;
	}

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(&dummy_item, obj, amt);

	/* Check if the store has space for the items */
	if (!store_check_num(store, &dummy_item)) {
		object_wipe(&dummy_item);
		msg("I have not the room in my store to keep it.");
		return;
	}

	/* Get the label */
	label = gear_to_label(player, obj);

	price = price_item(store, &dummy_item, true, amt);

	/* Get some money */
	player->au += price;

	/* Update the auto-history if selling an artifact that was previously
	 * un-IDed. (Ouch!) */
	if (obj->artifact)
		history_find_artifact(player, obj->artifact);

	/* Update the gear */
	player->upkeep->update |= (PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	/* Get the "apparent" value */
	dummy = object_value(&dummy_item, amt);
	/*
	 * Do not need the dummy any more so release the memory allocated
	 * within it.
	 */
	object_wipe(&dummy_item);

	/* Know flavor of consumables */
	object_flavor_aware(player, obj);
	obj->known->effect = obj->effect;
	while (!object_fully_known(obj)) {
		object_learn_unknown_rune(player, obj);
		player_know_object(player, obj);
	}

	/* Take a proper copy of the now known-about object. */
	sold_item = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Get the "actual" value */
	value = object_value_real(sold_item, amt);

	/* Get the description all over again */
	object_desc(o_name, sizeof(o_name), sold_item,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Describe the result (in message buffer) */
	if (OPT(player, birth_no_selling)) {
		msg("You had %s (%c).", o_name, label);
	} else {
		msg("You sold %s (%c) for %d gold.", o_name, label, price);

		/* Analyze the prices (and comment verbally) */
		purchase_analyze(price, value, dummy);
	}

	/* Autoinscribe if we still have any */
	if (!none_left)
		apply_autoinscription(player, obj);

	/* Set ignore flag */
	player->upkeep->notice |= PN_IGNORE;

	/* Notice if pack items need to be combined or reordered */
	notice_stuff(player);

	/* Handle stuff */
	handle_stuff(player);

	/* The store gets that (known) object */
	if (!store_carry(store, sold_item)) {
		/* The store rejected it; delete. */
		if (sold_item->artifact) {
			history_lose_artifact(player, sold_item->artifact);
		}
		if (sold_item->known) {
			object_delete(NULL, NULL, &sold_item->known);
			sold_item->known = NULL;
		}
		object_delete(NULL, NULL, &sold_item);
	}

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}